

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O3

mfb_stub * mfb_stub::GetInstance(mfb_window *window)

{
  pointer __position;
  mfb_stub *__s;
  pointer ppmVar1;
  mfb_stub *local_20;
  
  ppmVar1 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (GetInstance(mfb_window*)::s_instances == '\0') {
    GetInstance();
    ppmVar1 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  while( true ) {
    __position = GetInstance::s_instances.
                 super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    if (ppmVar1 ==
        GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      __s = (mfb_stub *)operator_new(0xe8);
      memset(__s,0,0xe8);
      if (__position ==
          GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_20 = __s;
        std::vector<mfb_stub*,std::allocator<mfb_stub*>>::_M_realloc_insert<mfb_stub*>
                  ((vector<mfb_stub*,std::allocator<mfb_stub*>> *)&GetInstance::s_instances,
                   (iterator)__position,&local_20);
      }
      else {
        *__position = __s;
        GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl
        .super__Vector_impl_data._M_finish =
             GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
      super__Vector_impl_data._M_finish[-1]->m_window = window;
      return GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    }
    if ((*ppmVar1)->m_window == window) break;
    ppmVar1 = ppmVar1 + 1;
  }
  return *ppmVar1;
}

Assistant:

mfb_stub *
mfb_stub::GetInstance(struct mfb_window *window) {
    static std::vector<mfb_stub *>  s_instances;

    for(mfb_stub *instance : s_instances) {
        if(instance->m_window == window) {
            return instance;
        }
    }

    s_instances.push_back(new mfb_stub);
    s_instances.back()->m_window = window;

    return s_instances.back();
}